

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

char * escapestring(char *s)

{
  vector<char> *this;
  byte bVar1;
  undefined8 in_RAX;
  char *v;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (escapestring(char_const*)::strbuf == '\0') {
    escapestring();
  }
  escapestring::stridx = escapestring::stridx + ((escapestring::stridx + 1U) / 3) * -3 + 1;
  this = (vector<char> *)
         ((long)&escapestring::strbuf[0].buf + (ulong)(uint)(escapestring::stridx * 0x10));
  *(undefined4 *)((long)&escapestring::strbuf[0].ulen + (ulong)(uint)(escapestring::stridx * 0x10))
       = 0;
  uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
  vector<char>::add(this,(char *)((long)&uStack_38 + 7));
  do {
    bVar1 = *s;
    if (bVar1 < 0xc) {
      if (bVar1 == 9) {
        v = "^t";
        goto LAB_0012c2a7;
      }
      if (bVar1 == 10) {
        v = "^n";
        goto LAB_0012c2a7;
      }
      if (bVar1 == 0) {
        vector<char>::put(this,"\"",2);
        return this->buf;
      }
LAB_0012c2ba:
      vector<char>::add(this,s);
    }
    else {
      if (bVar1 == 0xc) {
        v = "^f";
      }
      else if (bVar1 == 0x22) {
        v = "^\"";
      }
      else {
        if (bVar1 != 0x5e) goto LAB_0012c2ba;
        v = "^^";
      }
LAB_0012c2a7:
      vector<char>::put(this,v,2);
    }
    s = (char *)((byte *)s + 1);
  } while( true );
}

Assistant:

const char *escapestring(const char *s)
{
    static vector<char> strbuf[3];
    static int stridx = 0;
    stridx = (stridx + 1)%3;
    vector<char> &buf = strbuf[stridx];
    buf.setsize(0);
    buf.add('"');
    for(; *s; s++) switch(*s)
    {
        case '\n': buf.put("^n", 2); break;
        case '\t': buf.put("^t", 2); break;
        case '\f': buf.put("^f", 2); break;
        case '"': buf.put("^\"", 2); break;
        case '^': buf.put("^^", 2); break;
        default: buf.add(*s); break;
    }
    buf.put("\"\0", 2);
    return buf.getbuf();
}